

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O1

void __thiscall
message_test_should_create_repeating_group_Test::TestBody
          (message_test_should_create_repeating_group_Test *this)

{
  size_type *psVar1;
  size_type *psVar2;
  _Base_bitset<1UL> _Var3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  char *pcVar7;
  char *in_R9;
  undefined1 local_1028 [8];
  Logon logon;
  Instance instance;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar_;
  
  memset(local_1028,0,0xd58);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_false>.
  value.val_._0_1_ = 1;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_false>.
  value.empty_ = false;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_false>.
  value._9_7_ = 0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_false>.
  value.val_._0_1_ = 1;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_false>.
  value.empty_ = false;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_false>.
  value._9_7_ = 0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>.
  value.val_._0_1_ = 1;
  psVar1 = (size_type *)
           ((long)&logon.
                   super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                   .
                   super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                   .values.base.
                   super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>
                   .value + 8);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.val_._M_dataplus._M_p = (pointer)0x0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.val_._M_string_length._0_1_ = 0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.val_.field_2._M_local_buf[8] = '\x01';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.empty_ = false;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value._33_1_ = 1;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<4UL,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_false>
  .value.val_.m_value = false;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<4UL,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_false>
  .value.empty_ = false;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base._90_6_ = 0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>.
  value.val_._0_1_ = 1;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>.
  value._8_8_ = psVar1;
  memset((bool *)((long)&logon.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         .values.base.
                         super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                         .value + 8),0,0xce8);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>.
  value._8_8_ = (long)&logon.
                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .
                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .values.base.
                       super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .value + 0x10;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.
  super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  .
  super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)&logon.
                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .
                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .values.base.
                       super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .value + 0xce0);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .allBits.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)
       ((long)&logon.
               super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .
               super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .unparsed.
               super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed>
               .
               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
       + 0x10);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x140] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x141] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x142] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x143] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x144] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x145] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x146] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_328UL>.buffer[0x147] = '\0';
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .requiredBits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)(logon.
                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .
                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .unparsed.Storage.InlineElts + 8) + 0x10);
  psVar2 = (size_type *)
           ((long)&instance.
                   super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                   .values.base.
                   super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>
                   .value.val_ + 8);
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.val_.field_2._M_allocated_capacity = 0;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.val_._M_dataplus._M_p = (pointer)0x0;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.val_._M_string_length = 0;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.val_.field_2._8_8_ = 1;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.empty_ = false;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value._33_1_ = 1;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value._34_6_ = 0;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  ._48_8_ = 0;
  _Var3._M_w = (long)&instance.
                      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                      .super_SmallVectorBase + 0x10;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)instance.
                      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer +
               0x10);
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .values.base.
  super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .value.val_.
  super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  .
  super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
  .super_SmallVectorBase.BeginX =
       (void *)logon.
               super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .
               super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .values.base.
               super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>.
               value._8_8_;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX =
       (void *)logon.
               super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .
               super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
               .allBits.super__Base_bitset<1UL>._M_w;
  logon.
  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .
  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ = psVar2;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .allBits.super__Base_bitset<1UL>._M_w = _Var3;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = (void *)_Var3;
  Fixpp::
  set<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char_const(&)[5]>
            ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              *)((long)(logon.
                        super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .
                        super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .unparsed.Storage.InlineElts + 8) + 0x10),(char (*) [5])"TEST");
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value.empty_ = true;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  .values.base.super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
  value._33_1_ = 0;
  instance.
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
  ._48_8_ = instance.
            super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
            ._48_8_ | 2;
  pTVar5 = Fixpp::
           get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                     ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       *)((long)(logon.
                                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .
                                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .unparsed.Storage.InlineElts + 8) + 0x10));
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_68,"Fixpp::get<Tag::RefMsgType>(instance)","\"TEST\"",pTVar5,
             (char (*) [5])"TEST");
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
               ,0x30,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pTVar6 = Fixpp::
             get<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                       ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         *)((long)(logon.
                                   super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                   .
                                   super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                   .unparsed.Storage.InlineElts + 8) + 0x10));
    local_48.ptr_._0_1_ = 0x53;
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)local_68,"Fixpp::get<Tag::MsgDirection>(instance)","\'S\'",pTVar6,
               (char *)&local_48);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                 ,0x31,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      llvm::
      SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
      ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                   *)((long)&logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .values.base.
                             super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                             .value + 8),
                  (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                   *)((long)(logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .unparsed.Storage.InlineElts + 8) + 0x10));
      Fixpp::
      set<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char_const(&)[3]>
                ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  *)((long)(logon.
                            super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .
                            super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .unparsed.Storage.InlineElts + 8) + 0x10),(char (*) [3])"MD");
      instance.
      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.value.
      empty_ = true;
      instance.
      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.value.
      _33_1_ = 0;
      instance.
      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      ._48_8_ = instance.
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                ._48_8_ | 2;
      pTVar5 = Fixpp::
               get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                         ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                           *)((long)(logon.
                                     super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                     .
                                     super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                     .unparsed.Storage.InlineElts + 8) + 0x10));
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
                ((internal *)local_68,"Fixpp::get<Tag::RefMsgType>(instance)","\"MD\"",pTVar5,
                 (char (*) [3])"MD");
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                   ,0x38,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_48.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_48.ptr_ + 8))();
          }
          local_48.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pTVar6 = Fixpp::
                 get<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                           ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             *)((long)(logon.
                                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                       .
                                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                       .unparsed.Storage.InlineElts + 8) + 0x10));
        local_48.ptr_._0_1_ = 0x53;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)local_68,"Fixpp::get<Tag::MsgDirection>(instance)","\'S\'",pTVar6,
                   (char *)&local_48);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (gtest_ar._0_8_ == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                     ,0x39,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if (local_48.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_48.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_48.ptr_ + 8))();
            }
            local_48.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          llvm::
          SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
          ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       *)((long)&logon.
                                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .
                                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .values.base.
                                 super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                 .value + 8),
                      (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       *)((long)(logon.
                                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .
                                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                 .unparsed.Storage.InlineElts + 8) + 0x10));
          local_48.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((long)logon.
                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .
                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .values.base.
                       super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .value.val_.
                       super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.BeginX -
                 logon.
                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .
                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .values.base.
                 super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>.
                 value._8_8_ >> 3) * -0x7063e7063e7063e7);
          gtest_ar_.message_.ptr_._0_4_ = 2;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)local_68,"group.size()","2",(unsigned_long *)&local_48,
                     (int *)&gtest_ar_.message_);
          if (local_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                       ,0x3d,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if (local_48.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_48.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_48.ptr_ + 8))();
              }
              local_48.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_48.ptr_._0_1_ =
                 (void *)logon.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                         .values.base.
                         super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                         .value._8_8_ !=
                 logon.
                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .
                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .values.base.
                 super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                 .value.val_.
                 super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                 .
                 super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                 .super_SmallVectorBase.BeginX;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            if ((void *)logon.
                        super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .
                        super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .values.base.
                        super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                        .value._8_8_ ==
                logon.
                super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                .
                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                .values.base.
                super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                .value.val_.
                super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                .
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                .
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                .super_SmallVectorBase.BeginX) {
              testing::Message::Message((Message *)&gtest_ar_.message_);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_68,(internal *)&local_48,
                         (AssertionResult *)"repeatingGroup.empty()","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         ((long)instance.
                                super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.
                                buffer + 0x10),kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                         ,0x45,(char *)CONCAT71(local_68._1_7_,local_68[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         ((long)instance.
                                super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.
                                buffer + 0x10),(Message *)&gtest_ar_.message_);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         ((long)instance.
                                super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.
                                buffer + 0x10));
              if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT71(local_68._1_7_,local_68[0]) != &gtest_ar.message_) {
                operator_delete((undefined1 *)CONCAT71(local_68._1_7_,local_68[0]),
                                (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
              }
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   (gtest_ar_.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                  (**(code **)(((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p + 8))();
                }
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_48.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((long)logon.
                           super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                           .
                           super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                           .values.base.
                           super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                           .value.val_.
                           super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX -
                     logon.
                     super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                     .
                     super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                     .values.base.
                     super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                     .value._8_8_ >> 3) * -0x7063e7063e7063e7);
              gtest_ar_.message_.ptr_._0_4_ = 2;
              testing::internal::CmpHelperEQ<unsigned_long,int>
                        ((internal *)local_68,"repeatingGroup.size()","2",(unsigned_long *)&local_48
                         ,(int *)&gtest_ar_.message_);
              if (local_68[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_48);
                if (gtest_ar._0_8_ == 0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                           ,0x46,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if (local_48.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar4 = testing::internal::IsTrue(true);
                  if ((bVar4) &&
                     (local_48.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_48.ptr_ + 8))();
                  }
                  local_48.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_48.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (((long)logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .values.base.
                             super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                             .value.val_.
                             super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                             .
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                             .
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                             .super_SmallVectorBase.BeginX -
                       logon.
                       super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .
                       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       .values.base.
                       super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                       .value._8_8_ >> 3) * -0x7063e7063e7063e7);
                gtest_ar_.message_.ptr_._0_4_ = 2;
                testing::internal::CmpHelperEQ<unsigned_long,int>
                          ((internal *)local_68,"groupValues.size()","2",(unsigned_long *)&local_48,
                           (int *)&gtest_ar_.message_);
                if (local_68[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_48);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                             ,0x49,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if (local_48.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar4 = testing::internal::IsTrue(true);
                    if ((bVar4) &&
                       (local_48.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_48.ptr_ + 8))();
                    }
                    local_48.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  if (logon.
                      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                      .
                      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                      .values.base.
                      super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                      .value.val_.
                      super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                      .
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                      .super_SmallVectorBase.BeginX ==
                      (void *)logon.
                              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                              .
                              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                              .values.base.
                              super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                              .value._8_8_) {
LAB_00129f36:
                    __assert_fail("idx < size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                                  ,0x187,
                                  "const_reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) const [T = Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                                 );
                  }
                  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                            ((internal *)local_68,"meta::get<0>(groupValues[0].values).get()",
                             "\"TEST\"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .values.base.
                             super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                             .value._8_8_,(char (*) [5])"TEST");
                  if (local_68[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_48);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                               ,0x4b,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if (local_48.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar4 = testing::internal::IsTrue(true);
                      if ((bVar4) &&
                         (local_48.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_48.ptr_ + 8))();
                      }
                      local_48.ptr_ =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    if (logon.
                        super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .
                        super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        .values.base.
                        super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                        .value.val_.
                        super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                        .
                        super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                        .
                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                        .super_SmallVectorBase.BeginX ==
                        (void *)logon.
                                super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                .
                                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                .values.base.
                                super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                .value._8_8_) goto LAB_00129f36;
                    local_48.ptr_._0_1_ = 0x53;
                    testing::internal::CmpHelperEQ<char,char>
                              ((internal *)local_68,"meta::get<1>(groupValues[0].values).get()",
                               "\'S\'",(char *)(logon.
                                                super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                                .
                                                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                                .values.base.
                                                super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                                .value._8_8_ + 0x28),(char *)&local_48);
                    if (local_68[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_48);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar7 = "";
                      }
                      else {
                        pcVar7 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                 ,0x4c,pcVar7);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if (local_48.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        bVar4 = testing::internal::IsTrue(true);
                        if ((bVar4) &&
                           (local_48.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0)) {
                          (**(code **)(*(long *)local_48.ptr_ + 8))();
                        }
                        local_48.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x0;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      if ((ulong)(((long)logon.
                                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                         .
                                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                         .values.base.
                                         super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                         .value.val_.
                                         super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                                         .
                                         super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                         .
                                         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                                         .super_SmallVectorBase.BeginX -
                                   logon.
                                   super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                   .
                                   super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                   .values.base.
                                   super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                   .value._8_8_ >> 3) * -0x7063e7063e7063e7) < 2) goto LAB_00129f36;
                      testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
                                ((internal *)local_68,"meta::get<0>(groupValues[1].values).get()",
                                 "\"MD\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(logon.
                                              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                              .
                                              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                              .values.base.
                                              super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                              .value._8_8_ + 0x148),(char (*) [3])"MD");
                      if (local_68[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_48);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar7 = "";
                        }
                        else {
                          pcVar7 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                   ,0x4e,pcVar7);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if (local_48.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          bVar4 = testing::internal::IsTrue(true);
                          if ((bVar4) &&
                             (local_48.ptr_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0)) {
                            (**(code **)(*(long *)local_48.ptr_ + 8))();
                          }
                          local_48.ptr_ =
                               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)0x0;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        if ((ulong)(((long)logon.
                                           super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                           .
                                           super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                           .values.base.
                                           super_tuple_value<6UL,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                           .value.val_.
                                           super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                                           .
                                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                                           .
                                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                                           .super_SmallVectorBase.BeginX -
                                     logon.
                                     super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                     .
                                     super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                     .values.base.
                                     super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                     .value._8_8_ >> 3) * -0x7063e7063e7063e7) < 2)
                        goto LAB_00129f36;
                        local_48.ptr_._0_1_ = 0x53;
                        testing::internal::CmpHelperEQ<char,char>
                                  ((internal *)local_68,"meta::get<1>(groupValues[1].values).get()",
                                   "\'S\'",(char *)(logon.
                                                  super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                                  .
                                                  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                                  .values.base.
                                                  super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                                  .value._8_8_ + 0x170),(char *)&local_48);
                        if (local_68[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_48);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar7 = "";
                          }
                          else {
                            pcVar7 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                                     ,0x4f,pcVar7);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_);
                          if (local_48.ptr_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            bVar4 = testing::internal::IsTrue(true);
                            if ((bVar4) &&
                               (local_48.ptr_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0)) {
                              (**(code **)(*(long *)local_48.ptr_ + 8))();
                            }
                            local_48.ptr_ =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (instance.
      super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .allBits.super__Base_bitset<1UL>._M_w != (_Base_bitset<1UL>)_Var3._M_w) {
    free((void *)instance.
                 super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                 .allBits.super__Base_bitset<1UL>._M_w);
  }
  if ((size_type *)
      logon.
      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ != psVar2) {
    operator_delete((void *)logon.
                            super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .
                            super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer
                            ._16_8_,
                    instance.
                    super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                    .values.base.
                    super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>
                    .value.val_._M_string_length + 1);
  }
  if (logon.
      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .allBits.super__Base_bitset<1UL>._M_w !=
      (_Base_bitset<1UL>)
      ((long)&logon.
              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              .
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
      + 0x10U)) {
    free((void *)logon.
                 super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .
                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                 .allBits.super__Base_bitset<1UL>._M_w);
  }
  llvm::
  SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  ::~SmallVectorImpl((SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                      *)((long)&logon.
                                super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                .
                                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                .values.base.
                                super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_false>
                                .value + 8));
  if ((size_type *)
      logon.
      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .values.base.super_tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>.
      value._8_8_ != psVar1) {
    operator_delete((void *)logon.
                            super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .
                            super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                            .values.base.
                            super_tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>
                            .value._8_8_,
                    CONCAT71(logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .values.base.
                             super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>
                             .value.val_._M_string_length._1_7_,
                             (undefined1)
                             logon.
                             super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .
                             super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                             .values.base.
                             super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>
                             .value.val_._M_string_length) + 1);
  }
  return;
}

Assistant:

TEST(message_test, should_create_repeating_group)
{
    Fixpp::v42::Message::Logon logon;

    using namespace Fixpp;

    // First, we create a new group and add 2 instances

    auto group = Fixpp::createGroup<Tag::NoMsgTypes>(logon, 2);
    auto instance = group.instance();

    Fixpp::set<Tag::RefMsgType>(instance, "TEST");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "TEST");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    Fixpp::set<Tag::RefMsgType>(instance, "MD");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "MD");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    ASSERT_EQ(group.size(), 2);

    // Let's now check that values have been written in the message itself
    auto& values = logon.values;

    // NoMsgTypes RepeatinGroup is the 7th field in the Logon message
    auto& repeatingGroup = meta::get<6>(values);

    ASSERT_FALSE(repeatingGroup.empty());
    ASSERT_EQ(repeatingGroup.size(), 2);

    const auto& groupValues = repeatingGroup.get();
    ASSERT_EQ(groupValues.size(), 2);

    ASSERT_EQ(meta::get<0>(groupValues[0].values).get(), "TEST");
    ASSERT_EQ(meta::get<1>(groupValues[0].values).get(), 'S');

    ASSERT_EQ(meta::get<0>(groupValues[1].values).get(), "MD");
    ASSERT_EQ(meta::get<1>(groupValues[1].values).get(), 'S');
}